

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_utils.hpp
# Opt level: O3

uhugeint_t
duckdb::NumericCastImpl<duckdb::uhugeint_t,_duckdb::hugeint_t,_false>::Convert(hugeint_t val)

{
  size_type sVar1;
  bool bVar2;
  InternalException *this;
  pointer __dest;
  int64_t in_RSI;
  uint64_t in_RDI;
  uhugeint_t uVar3;
  uhugeint_t params_1;
  hugeint_t params;
  size_type __dnew;
  type unsigned_max;
  type unsigned_in;
  type signed_min;
  type signed_in;
  uhugeint_t minval;
  size_type local_f8;
  uint64_t uStack_f0;
  int64_t local_e8;
  uint64_t local_e0;
  hugeint_t local_d8;
  uhugeint_t local_c8;
  uhugeint_t local_b8;
  string local_a8;
  uint64_t local_88;
  uint64_t uStack_80;
  hugeint_t local_78;
  hugeint_t local_68;
  uhugeint_t local_58;
  uhugeint_t local_48;
  
  local_48.lower = 0;
  local_48.upper = 0;
  local_58.lower._0_4_ = 0xffffffff;
  local_58.lower._4_4_ = 0xffffffff;
  local_58.upper._0_4_ = 0xffffffff;
  local_58.upper._4_4_ = 0xffffffff;
  local_d8.lower = in_RDI;
  local_d8.upper = in_RSI;
  local_b8 = hugeint_t::operator_cast_to_uhugeint_t(&local_d8);
  local_c8.lower = CONCAT44(local_58.lower._4_4_,(undefined4)local_58.lower);
  local_c8.upper = CONCAT44(local_58.upper._4_4_,(undefined4)local_58.upper);
  local_68.lower = local_d8.lower;
  local_68.upper = local_d8.upper;
  local_78 = uhugeint_t::operator_cast_to_hugeint_t(&local_48);
  uhugeint_t::operator_cast_to_hugeint_t(&local_58);
  bVar2 = hugeint_t::operator<(&local_68,&local_78);
  if (!bVar2) {
    bVar2 = uhugeint_t::operator>(&local_b8,&local_c8);
    if (!bVar2) {
      uVar3 = hugeint_t::operator_cast_to_uhugeint_t(&local_d8);
      return uVar3;
    }
  }
  local_e0 = local_d8.lower;
  local_e8 = local_d8.upper;
  params_1 = hugeint_t::operator_cast_to_uhugeint_t(&local_78);
  local_88 = local_c8.lower;
  uStack_80 = local_c8.upper;
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_f8 = 0x4b;
  __dest = (pointer)::std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_f8);
  sVar1 = local_f8;
  local_a8.field_2._M_allocated_capacity = local_f8;
  local_a8._M_dataplus._M_p = __dest;
  switchD_015de399::default
            (__dest,"Information loss on integer cast: value %d outside of target range [%d, %d]",
             0x4b);
  local_a8._M_string_length = sVar1;
  __dest[sVar1] = '\0';
  local_f8 = local_88;
  uStack_f0 = uStack_80;
  uVar3.upper = uStack_80;
  uVar3.lower = local_88;
  params.upper = local_e8;
  params.lower = local_e0;
  InternalException::InternalException<duckdb::hugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
            (this,&local_a8,params,params_1,uVar3);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static TO Convert(FROM val) {
		// some dance around signed-unsigned integer comparison below
		auto minval = NumericLimits<TO>::Minimum();
		auto maxval = NumericLimits<TO>::Maximum();
		auto unsigned_in = static_cast<typename MakeUnsigned<FROM>::type>(val);
		auto unsigned_min = static_cast<typename MakeUnsigned<TO>::type>(minval);
		auto unsigned_max = static_cast<typename MakeUnsigned<TO>::type>(maxval);
		auto signed_in = static_cast<typename MakeSigned<FROM>::type>(val);
		auto signed_min = static_cast<typename MakeSigned<TO>::type>(minval);
		auto signed_max = static_cast<typename MakeSigned<TO>::type>(maxval);

		if (!NumericLimits<FROM>::IsSigned() && !NumericLimits<TO>::IsSigned() &&
		    (unsigned_in < unsigned_min || unsigned_in > unsigned_max)) {
			ThrowNumericCastError(val, static_cast<TO>(unsigned_min), static_cast<TO>(unsigned_max));
		}

		if (NumericLimits<FROM>::IsSigned() && NumericLimits<TO>::IsSigned() &&
		    (signed_in < signed_min || signed_in > signed_max)) {
			ThrowNumericCastError(val, static_cast<TO>(signed_min), static_cast<TO>(signed_max));
		}

		if (NumericLimits<FROM>::IsSigned() != NumericLimits<TO>::IsSigned() &&
		    (signed_in < signed_min || unsigned_in > unsigned_max)) {
			ThrowNumericCastError(val, static_cast<TO>(signed_min), static_cast<TO>(unsigned_max));
		}

		return static_cast<TO>(val);
	}